

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::FailureMessage::simple_abi_cxx11_(App *app,Error *e)

{
  bool bVar1;
  char *pcVar2;
  Option *pOVar3;
  long *in_RDX;
  App *in_RSI;
  string *in_RDI;
  string *in_stack_00000050;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000058;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string *header;
  bool in_stack_000001c6;
  bool in_stack_000001c7;
  Option *in_stack_000001c8;
  value_type *in_stack_fffffffffffffe78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Option *in_stack_fffffffffffffe88;
  undefined1 local_131 [33];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [79];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  App *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  pcVar2 = (char *)(**(code **)(*in_RDX + 0x10))();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,pcVar2,&local_41);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string(local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x164d57);
  pOVar3 = App::get_help_ptr(local_10);
  if (pOVar3 != (Option *)0x0) {
    App::get_help_ptr(local_10);
    Option::get_name_abi_cxx11_(in_stack_000001c8,in_stack_000001c7,in_stack_000001c6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(local_90);
  }
  pOVar3 = App::get_help_all_ptr(local_10);
  if (pOVar3 != (Option *)0x0) {
    in_stack_fffffffffffffe88 = App::get_help_all_ptr(local_10);
    Option::get_name_abi_cxx11_(in_stack_000001c8,in_stack_000001c7,in_stack_000001c6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(local_b0);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pOVar3);
  if (!bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_131;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(local_131 + 1)," or ",(allocator *)__rhs);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_00000058,in_stack_00000050);
    ::std::operator+((char *)in_stack_fffffffffffffe88,__rhs);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe88,(char *)__rhs);
    ::std::__cxx11::string::operator+=((string *)in_RDI,local_d0);
    ::std::__cxx11::string::~string(local_d0);
    ::std::__cxx11::string::~string(local_f0);
    ::std::__cxx11::string::~string(local_110);
    ::std::__cxx11::string::~string((string *)(local_131 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_131);
  }
  local_19 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)pOVar3);
  if ((local_19 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string simple(const App *app, const Error &e) {
    std::string header = std::string(e.what()) + "\n";
    std::vector<std::string> names;

    // Collect names
    if(app->get_help_ptr() != nullptr)
        names.push_back(app->get_help_ptr()->get_name());

    if(app->get_help_all_ptr() != nullptr)
        names.push_back(app->get_help_all_ptr()->get_name());

    // If any names found, suggest those
    if(!names.empty())
        header += "Run with " + detail::join(names, " or ") + " for more information.\n";

    return header;
}